

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O0

bool __thiscall boost::thread::start_thread_noexcept(thread *this)

{
  int iVar1;
  type ptVar2;
  element_type *__arg;
  shared_ptr<boost::detail::thread_data_base> *in_RDI;
  int res;
  shared_ptr<boost::detail::thread_data_base> *in_stack_ffffffffffffffe0;
  shared_ptr<boost::detail::thread_data_base> *this_00;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  shared_ptr<boost::detail::thread_data_base> *this_01;
  
  this_01 = in_RDI;
  shared_ptr<boost::detail::thread_data_base>::operator->(in_stack_ffffffffffffffe0);
  shared_ptr<boost::detail::thread_data_base>::operator=
            (this_01,(shared_ptr<boost::detail::thread_data_base> *)
                     CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  ptVar2 = shared_ptr<boost::detail::thread_data_base>::operator->(in_stack_ffffffffffffffe0);
  this_00 = (shared_ptr<boost::detail::thread_data_base> *)&ptVar2->thread_handle;
  __arg = shared_ptr<boost::detail::thread_data_base>::get(in_RDI);
  iVar1 = pthread_create((pthread_t *)this_00,(pthread_attr_t *)0x0,
                         (anonymous_namespace)::thread_proxy,__arg);
  if (iVar1 != 0) {
    shared_ptr<boost::detail::thread_data_base>::operator->(this_00);
    shared_ptr<boost::detail::thread_data_base>::reset(this_01);
  }
  return iVar1 == 0;
}

Assistant:

bool thread::start_thread_noexcept()
    {
        thread_info->self=thread_info;
        int const res = pthread_create(&thread_info->thread_handle, 0, &thread_proxy, thread_info.get());
        if (res != 0)
        {
            thread_info->self.reset();
            return false;
        }
        return true;
    }